

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_functional_test.cc
# Opt level: O0

void iterator_compact_uncommitted_db(void)

{
  fdb_status fVar1;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  fdb_iterator *it;
  fdb_status status;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  char bodybuf [256];
  char keybuf [256];
  int n;
  int r;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  fdb_kvs_handle *in_stack_fffffffffffffc28;
  fdb_file_handle *in_stack_fffffffffffffc30;
  fdb_iterator *in_stack_fffffffffffffc38;
  fdb_kvs_handle *in_stack_fffffffffffffc48;
  char *in_stack_fffffffffffffc50;
  size_t in_stack_fffffffffffffc58;
  char *in_stack_fffffffffffffc60;
  fdb_kvs_handle *in_stack_fffffffffffffc68;
  fdb_iterator *local_288;
  fdb_status local_27c;
  fdb_kvs_handle *local_278;
  char local_268 [56];
  fdb_kvs_config *in_stack_fffffffffffffdd0;
  char *in_stack_fffffffffffffdd8;
  fdb_kvs_handle **in_stack_fffffffffffffde0;
  fdb_file_handle *in_stack_fffffffffffffde8;
  fdb_config *in_stack_fffffffffffffe48;
  char *in_stack_fffffffffffffe50;
  fdb_file_handle **in_stack_fffffffffffffe58;
  char local_168 [268];
  int local_5c;
  int local_58;
  uint local_54;
  __time_t local_30;
  __suseconds_t local_28;
  timeval local_10;
  
  gettimeofday(&local_10,(__timezone_ptr_t)0x0);
  local_30 = local_10.tv_sec;
  local_28 = local_10.tv_usec;
  memleak_start();
  local_5c = 10;
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  local_58 = system("rm -rf  iterator_test* > errorlog.txt");
  fdb_open(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  fdb_kvs_open(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
               in_stack_fffffffffffffdd0);
  for (local_54 = 0; (int)local_54 < local_5c; local_54 = local_54 + 1) {
    sprintf(local_168,"key%d",(ulong)local_54);
    sprintf(local_268,"body%d",(ulong)local_54);
    in_stack_fffffffffffffc50 = local_168;
    in_stack_fffffffffffffc48 = local_278;
    in_stack_fffffffffffffc58 = strlen(local_168);
    in_stack_fffffffffffffc60 = local_268;
    strlen(local_268);
    fdb_set_kv(in_stack_fffffffffffffc68,in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,
               in_stack_fffffffffffffc50,(size_t)in_stack_fffffffffffffc48);
  }
  local_27c = fdb_iterator_sequence_init(local_278,&local_288,0,0,0);
  if (local_27c != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x1c3);
    iterator_compact_uncommitted_db::__test_pass = 0;
    if (local_27c != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x1c3,"void iterator_compact_uncommitted_db()");
    }
  }
  local_54 = 0;
  do {
    local_54 = local_54 + 1;
    fVar1 = fdb_iterator_next((fdb_iterator *)in_stack_fffffffffffffc28);
  } while (fVar1 != FDB_RESULT_ITERATOR_FAIL);
  fdb_iterator_close(in_stack_fffffffffffffc38);
  if (local_54 != local_5c) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x1c8);
    iterator_compact_uncommitted_db::__test_pass = 0;
    if (local_54 != local_5c) {
      __assert_fail("i == n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x1c8,"void iterator_compact_uncommitted_db()");
    }
  }
  fdb_compact(in_stack_fffffffffffffc30,(char *)in_stack_fffffffffffffc28);
  for (local_54 = 0; (int)local_54 < local_5c; local_54 = local_54 + 1) {
    sprintf(local_168,"key%d",(ulong)local_54);
    sprintf(local_268,"body%d",(ulong)local_54);
    in_stack_fffffffffffffc28 = local_278;
    in_stack_fffffffffffffc38 = (fdb_iterator *)strlen(local_168);
    strlen(local_268);
    fdb_set_kv(in_stack_fffffffffffffc68,in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,
               in_stack_fffffffffffffc50,(size_t)in_stack_fffffffffffffc48);
  }
  local_27c = fdb_iterator_sequence_init(local_278,&local_288,0,0,0);
  if (local_27c != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x1d7);
    iterator_compact_uncommitted_db::__test_pass = 0;
    if (local_27c != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x1d7,"void iterator_compact_uncommitted_db()");
    }
  }
  local_54 = 0;
  do {
    local_54 = local_54 + 1;
    fVar1 = fdb_iterator_next((fdb_iterator *)in_stack_fffffffffffffc28);
  } while (fVar1 != FDB_RESULT_ITERATOR_FAIL);
  fdb_iterator_close(in_stack_fffffffffffffc38);
  if (local_54 != local_5c) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x1dc);
    iterator_compact_uncommitted_db::__test_pass = 0;
    if (local_54 != local_5c) {
      __assert_fail("i == n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x1dc,"void iterator_compact_uncommitted_db()");
    }
  }
  fdb_kvs_close(in_stack_fffffffffffffc28);
  fdb_close((fdb_file_handle *)in_stack_fffffffffffffc28);
  fdb_shutdown();
  memleak_end();
  if (iterator_compact_uncommitted_db::__test_pass == 0) {
    fprintf(_stderr,"%s FAILED\n","iterator compact uncommitted db");
  }
  else {
    fprintf(_stderr,"%s PASSED\n","iterator compact uncommitted db");
  }
  return;
}

Assistant:

void iterator_compact_uncommitted_db()
{
    TEST_INIT();
    memleak_start();

    int i, r;
    int n = 10;
    char keybuf[256], bodybuf[256];
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_status status;
    fdb_iterator *it;
    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.wal_threshold = 1024;
    fconfig.seqtree_opt = FDB_SEQTREE_USE; // enable seqtree since get_byseq
    fconfig.flags = FDB_OPEN_FLAG_CREATE;

    // remove previous iterator_test files
    r = system(SHELL_DEL" iterator_test* > errorlog.txt");
    (void)r;

    // open db
    fdb_open(&dbfile, "./iterator_test1", &fconfig);
    fdb_kvs_open(dbfile, &db, "db1", &kvs_config);


    // set docs
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_set_kv(db, keybuf, strlen(keybuf),
                bodybuf, strlen(bodybuf));
    }

    // count number of iteratable docs
    status = fdb_iterator_sequence_init(db, &it, 0, 0, FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    i=0;
    do { ++i; }
    while (fdb_iterator_next(it) != FDB_RESULT_ITERATOR_FAIL);
    fdb_iterator_close(it);
    TEST_CHK(i == n);

    // compact
    fdb_compact(dbfile, NULL);

    // set again
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_set_kv(db, keybuf, strlen(keybuf),
                bodybuf, strlen(bodybuf));
    }

    // count number of iteratable docs
    status = fdb_iterator_sequence_init(db, &it, 0, 0, FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    i=0;
    do { ++i; }
    while (fdb_iterator_next(it) != FDB_RESULT_ITERATOR_FAIL);
    fdb_iterator_close(it);
    TEST_CHK(i == n);


    fdb_kvs_close(db);
    fdb_close(dbfile);
    fdb_shutdown();

    memleak_end();
    TEST_RESULT("iterator compact uncommitted db");
}